

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::visitYieldStatement(CodegenVisitor *this,YieldStatement *yieldStmt)

{
  SQInteger SVar1;
  long arg1;
  Expr *pEVar2;
  TerminateStatement *in_RSI;
  SQFuncState *in_RDI;
  SQFuncState *unaff_retaddr;
  SQInteger retexp;
  SQInteger in_stack_ffffffffffffffd8;
  SQFuncState *pSVar3;
  SQOpcode _op;
  
  pSVar3 = in_RDI;
  SVar1 = SQFuncState::GetCurrentPos((SQFuncState *)0x1c5121);
  _op = (SQOpcode)((ulong)pSVar3 >> 0x20);
  arg1 = SVar1 + 1;
  *(undefined1 *)(in_RDI->_returnexp + 0x49) = 1;
  (**(code **)(in_RDI->lang_features + 0x100))(in_RDI,in_RSI);
  pEVar2 = TerminateStatement::argument(in_RSI);
  if (pEVar2 == (Expr *)0x0) {
    *(undefined8 *)(in_RDI->_returnexp + 8) = 0xffffffffffffffff;
    SQFuncState::GetStackSize((SQFuncState *)0x1c51d4);
    SQFuncState::AddInstruction
              (unaff_retaddr,_op,(SQInteger)in_RSI,arg1,(SQInteger)in_RDI,in_stack_ffffffffffffffd8)
    ;
  }
  else {
    *(long *)(in_RDI->_returnexp + 8) = arg1;
    SVar1 = SQFuncState::PopTarget(in_RDI);
    SQFuncState::GetStackSize((SQFuncState *)0x1c518f);
    SQFuncState::AddInstruction(unaff_retaddr,_op,(SQInteger)in_RSI,arg1,(SQInteger)in_RDI,SVar1);
  }
  return;
}

Assistant:

void CodegenVisitor::visitYieldStatement(YieldStatement *yieldStmt) {
    SQInteger retexp = _fs->GetCurrentPos() + 1;
    _fs->_bgenerator = true;
    visitTerminateStatement(yieldStmt);

    if (yieldStmt->argument()) {
        _fs->_returnexp = retexp;
        _fs->AddInstruction(_OP_YIELD, 1, _fs->PopTarget(), _fs->GetStackSize());
    }
    else {
        _fs->_returnexp = -1;
        _fs->AddInstruction(_OP_YIELD, 0xFF, 0, _fs->GetStackSize());
    }
}